

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_api.cc
# Opt level: O0

string * __thiscall
re2c::InputAPI::stmt_restorectx_abi_cxx11_
          (string *__return_storage_ptr__,InputAPI *this,uint32_t ind)

{
  opt_t *poVar1;
  uint32_t ind_00;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  undefined1 local_1d;
  uint local_1c;
  InputAPI *pIStack_18;
  uint32_t ind_local;
  InputAPI *this_local;
  string *s;
  
  local_1d = 0;
  local_1c = ind;
  pIStack_18 = this;
  this_local = (InputAPI *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if (this->type_ == DEFAULT) {
    indent_abi_cxx11_(&local_c0,(re2c *)(ulong)local_1c,ind_00);
    poVar1 = Opt::operator->((Opt *)&opts);
    std::operator+(&local_a0,&local_c0,&poVar1->yycursor);
    std::operator+(&local_80,&local_a0," = ");
    poVar1 = Opt::operator->((Opt *)&opts);
    std::operator+(&local_60,&local_80,&poVar1->yyctxmarker);
    std::operator+(&local_40,&local_60,";\n");
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  else if (this->type_ == CUSTOM) {
    indent_abi_cxx11_(&local_130,(re2c *)(ulong)local_1c,ind_00);
    poVar1 = Opt::operator->((Opt *)&opts);
    std::operator+(&local_110,&local_130,&poVar1->yyrestorectx);
    std::operator+(&local_f0,&local_110," ();\n");
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_130);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string InputAPI::stmt_restorectx (uint32_t ind) const
{
	std::string s;
	switch (type_)
	{
		case DEFAULT:
			s = indent (ind) + opts->yycursor + " = " + opts->yyctxmarker + ";\n";
			break;
		case CUSTOM:
			s = indent (ind) + opts->yyrestorectx + " ();\n";
			break;
	}
	return s;
}